

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O2

int i2c_ASN1_INTEGER(ASN1_INTEGER *a,uchar **pp)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uint8_t *buf;
  uint uVar4;
  uint8_t msb;
  CBS cbs;
  CBS copy;
  
  if (a == (ASN1_INTEGER *)0x0) {
    return 0;
  }
  cbs.data = a->data;
  cbs.len = (size_t)a->length;
  uVar3 = 1;
  while ((cbs.len != 0 && (*cbs.data == '\0'))) {
    CBS_skip(&cbs,1);
  }
  uVar4 = a->type;
  copy.data = cbs.data;
  copy.len = cbs.len;
  iVar2 = CBS_get_u8(&copy,&msb);
  bVar1 = true;
  if (iVar2 != 0) {
    if ((uVar4 >> 8 & 1) == 0) {
      uVar3 = (ulong)(msb >> 7);
    }
    else {
      if (msb < 0x81) {
        if (msb != 0x80) {
          bVar1 = false;
          uVar3 = 0;
          goto LAB_001f00a1;
        }
        uVar4 = is_all_zeros(copy.data,copy.len);
        uVar3 = (ulong)(uVar4 ^ 1);
      }
      bVar1 = false;
    }
  }
LAB_001f00a1:
  if ((uVar3 ^ 0x7fffffff) < cbs.len) {
    uVar4 = 0;
    ERR_put_error(0xc,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                  ,0x7e);
  }
  else {
    uVar4 = (int)cbs.len + (int)uVar3;
    if ((int)uVar4 < 1) {
      __assert_fail("len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                    ,0x82,"int i2c_ASN1_INTEGER(const ASN1_INTEGER *, unsigned char **)");
    }
    if (pp != (uchar **)0x0) {
      if (uVar3 != 0) {
        **pp = '\0';
      }
      if (cbs.len != 0) {
        memcpy(*pp + uVar3,cbs.data,cbs.len);
      }
      buf = *pp;
      if (bVar1) {
        if ((char)*buf < '\0') {
          __assert_fail("(*outp)[0] < 0x80",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                        ,0x8f,"int i2c_ASN1_INTEGER(const ASN1_INTEGER *, unsigned char **)");
        }
        uVar3 = (ulong)(uVar4 & 0x7fffffff);
      }
      else {
        uVar3 = (ulong)(uVar4 & 0x7fffffff);
        negate_twos_complement(buf,uVar3);
        buf = *pp;
        if (-1 < (char)*buf) {
          __assert_fail("(*outp)[0] >= 0x80",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                        ,0x8d,"int i2c_ASN1_INTEGER(const ASN1_INTEGER *, unsigned char **)");
        }
      }
      *pp = buf + uVar3;
    }
  }
  return uVar4;
}

Assistant:

int i2c_ASN1_INTEGER(const ASN1_INTEGER *in, unsigned char **outp) {
  if (in == NULL) {
    return 0;
  }

  // |ASN1_INTEGER|s should be represented minimally, but it is possible to
  // construct invalid ones. Skip leading zeros so this does not produce an
  // invalid encoding or break invariants.
  CBS cbs;
  CBS_init(&cbs, in->data, in->length);
  while (CBS_len(&cbs) > 0 && CBS_data(&cbs)[0] == 0) {
    CBS_skip(&cbs, 1);
  }

  int is_negative = (in->type & V_ASN1_NEG) != 0;
  size_t pad;
  CBS copy = cbs;
  uint8_t msb;
  if (!CBS_get_u8(&copy, &msb)) {
    // Zero is represented as a single byte.
    is_negative = 0;
    pad = 1;
  } else if (is_negative) {
    // 0x80...01 through 0xff...ff have a two's complement of 0x7f...ff
    // through 0x00...01 and need an extra byte to be negative.
    // 0x01...00 through 0x80...00 have a two's complement of 0xfe...ff
    // through 0x80...00 and can be negated as-is.
    pad = msb > 0x80 ||
          (msb == 0x80 && !is_all_zeros(CBS_data(&copy), CBS_len(&copy)));
  } else {
    // If the high bit is set, the signed representation needs an extra
    // byte to be positive.
    pad = (msb & 0x80) != 0;
  }

  if (CBS_len(&cbs) > INT_MAX - pad) {
    OPENSSL_PUT_ERROR(ASN1, ERR_R_OVERFLOW);
    return 0;
  }
  int len = (int)(pad + CBS_len(&cbs));
  assert(len > 0);
  if (outp == NULL) {
    return len;
  }

  if (pad) {
    (*outp)[0] = 0;
  }
  OPENSSL_memcpy(*outp + pad, CBS_data(&cbs), CBS_len(&cbs));
  if (is_negative) {
    negate_twos_complement(*outp, len);
    assert((*outp)[0] >= 0x80);
  } else {
    assert((*outp)[0] < 0x80);
  }
  *outp += len;
  return len;
}